

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::EnumGenerator
          (EnumGenerator *this,EnumDescriptor *descriptor)

{
  _Rb_tree_header *p_Var1;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar2;
  iterator iVar3;
  EnumDescriptor *in_RDX;
  EnumValueDescriptor *descriptor_00;
  EnumValueDescriptor *descriptor_01;
  long lVar4;
  long lVar5;
  EnumValueDescriptor *value;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_names;
  string value_name;
  objectivec *local_a0;
  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  *local_98;
  _Rb_tree<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*,std::_Identity<google::protobuf::EnumValueDescriptor_const*>,std::less<google::protobuf::EnumValueDescriptor_const*>,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
  *local_90;
  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  *local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_50;
  
  this->descriptor_ = descriptor;
  local_98 = &this->base_values_;
  (this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88 = &this->all_values_;
  (this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_90 = (_Rb_tree<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*,std::_Identity<google::protobuf::EnumValueDescriptor_const*>,std::less<google::protobuf::EnumValueDescriptor_const*>,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
              *)&this->alias_values_to_skip_;
  p_Var1 = &(this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header;
  (this->base_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->base_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->base_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->all_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->all_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->all_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  EnumName_abi_cxx11_(&this->name_,(objectivec *)descriptor,in_RDX);
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar5 = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar4 = 0; this_00 = this->descriptor_, lVar4 < *(int *)(this_00 + 4); lVar4 = lVar4 + 1) {
    local_a0 = (objectivec *)(*(long *)(this_00 + 0x28) + lVar5);
    pEVar2 = EnumDescriptor::FindValueByNumber
                       (this_00,*(int *)(*(long *)(this_00 + 0x28) + 4 + lVar5));
    if (local_a0 == (objectivec *)pEVar2) {
      std::
      vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ::push_back(local_98,(value_type *)&local_a0);
      EnumValueName_abi_cxx11_(&local_50,local_a0,descriptor_01);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_80,&local_50);
    }
    else {
      EnumValueName_abi_cxx11_(&local_50,local_a0,descriptor_00);
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_80,&local_50);
      if ((_Rb_tree_header *)iVar3._M_node == &local_80._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_80,&local_50);
      }
      else {
        std::
        _Rb_tree<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*,std::_Identity<google::protobuf::EnumValueDescriptor_const*>,std::less<google::protobuf::EnumValueDescriptor_const*>,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
        ::_M_insert_unique<google::protobuf::EnumValueDescriptor_const*const&>
                  (local_90,(EnumValueDescriptor **)&local_a0);
      }
    }
    std::__cxx11::string::~string((string *)&local_50);
    std::
    vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
    ::push_back(local_88,(value_type *)&local_a0);
    lVar5 = lVar5 + 0x20;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_80);
  return;
}

Assistant:

EnumGenerator::EnumGenerator(const EnumDescriptor* descriptor)
    : descriptor_(descriptor),
      name_(EnumName(descriptor_)) {
  // Track the names for the enum values, and if an alias overlaps a base
  // value, skip making a name for it. Likewise if two alias overlap, the
  // first one wins.
  // The one gap in this logic is if two base values overlap, but for that
  // to happen you have to have "Foo" and "FOO" or "FOO_BAR" and "FooBar",
  // and if an enum has that, it is already going to be confusing and a
  // compile error is just fine.
  // The values are still tracked to support the reflection apis and
  // TextFormat handing since they are different there.
  std::set<std::string> value_names;

  for (int i = 0; i < descriptor_->value_count(); i++) {
    const EnumValueDescriptor* value = descriptor_->value(i);
    const EnumValueDescriptor* canonical_value =
        descriptor_->FindValueByNumber(value->number());

    if (value == canonical_value) {
      base_values_.push_back(value);
      value_names.insert(EnumValueName(value));
    } else {
      std::string value_name(EnumValueName(value));
      if (value_names.find(value_name) != value_names.end()) {
        alias_values_to_skip_.insert(value);
      } else {
        value_names.insert(value_name);
      }
    }
    all_values_.push_back(value);
  }
}